

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void prepare_fpmt_workers
               (AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data,AVxWorkerHook hook,
               int parallel_frame_count)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  AV1_PRIMARY *ppi_00;
  int in_ECX;
  undefined8 in_RDX;
  aom_internal_error_info *in_RSI;
  long in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  AV1CdefSync *in_stack_00000010;
  int idx;
  int plane;
  int num_planes;
  int j;
  AV1_COMMON *cm;
  aom_internal_error_info *error;
  MultiThreadInfo *mt_info;
  AV1_COMP *cur_cpi;
  AVxWorker *frame_worker;
  int i;
  int frame_idx;
  int num_workers;
  PrimaryMultiThreadInfo *p_mt_info;
  aom_internal_error_info *in_stack_ffffffffffffff78;
  aom_internal_error_info *in_stack_ffffffffffffff80;
  undefined4 local_74;
  int local_6c;
  int local_64;
  long lVar5;
  int local_34;
  int local_30;
  
  iVar1 = *(int *)(in_RDI + 0x123d0);
  local_30 = 0;
  local_34 = 0;
  while (local_34 < iVar1) {
    lVar4 = *(long *)(in_RDI + 0x12408) + (long)local_34 * 0x38;
    *(long *)(in_RDI + 0x12420 + (long)local_30 * 8) = lVar4;
    lVar2 = *(long *)(in_RDI + (long)local_30 * 8);
    ppi_00 = (AV1_PRIMARY *)(lVar2 + 0x9ae48);
    lVar5 = *(long *)(lVar2 + 0x3bfb0);
    iVar3 = _setjmp((__jmp_buf_tag *)(lVar5 + 0xd8));
    if (iVar3 != 0) {
      *(undefined4 *)(lVar5 + 0xd0) = 0;
      restore_workers_after_fpmt(ppi_00,(int)((ulong)lVar5 >> 0x20),(int)lVar5);
      aom_internal_error_copy(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    *(undefined4 *)(lVar5 + 0xd0) = 1;
    *(long *)&ppi_00->parallel_frames_data[0].lib_flags =
         *(long *)(in_RDI + 0x12408) + (long)local_34 * 0x38;
    ppi_00->parallel_frames_data[0].ts_frame_start =
         *(long *)(in_RDI + 0x12410) + (long)local_34 * 0x1d0;
    iVar3 = compute_num_workers_per_frame(iVar1 - local_34,in_ECX - local_30);
    *(int *)ppi_00->parallel_cpi = iVar3;
    for (local_64 = 0; local_64 < 0xc; local_64 = local_64 + 1) {
      if (*(int *)ppi_00->parallel_cpi < *(int *)(in_RDI + 0x123d4 + (long)local_64 * 4)) {
        local_74 = *(undefined4 *)ppi_00->parallel_cpi;
      }
      else {
        local_74 = *(undefined4 *)(in_RDI + 0x123d4 + (long)local_64 * 4);
      }
      *(undefined4 *)((long)ppi_00->parallel_cpi + (long)local_64 * 4 + 4) = local_74;
    }
    if (*(long *)(in_RDI + 0x12418) != 0) {
      *(long *)((ppi_00->gf_group).ref_frame_list[0x31] + 4) =
           *(long *)(in_RDI + 0x12418) + (long)local_34 * 0x1f8;
      *(undefined8 *)((ppi_00->gf_group).ref_frame_list[0x32] + 4) =
           *(undefined8 *)(*(long *)((ppi_00->gf_group).ref_frame_list[0x31] + 4) + 0x28);
      iVar3 = av1_num_planes((AV1_COMMON *)(lVar2 + 0x3bf80));
      for (local_6c = 0; local_6c < iVar3; local_6c = local_6c + 1) {
        *(undefined8 *)((ppi_00->gf_group).ref_frame_list[(long)local_6c + 0x33] + 4) =
             *(undefined8 *)
              (*(long *)((ppi_00->gf_group).ref_frame_list[0x31] + 4) + 0x10 + (long)local_6c * 8);
      }
    }
    iVar3 = is_restoration_used((AV1_COMMON *)(lVar2 + 0x3bf80));
    if (iVar3 != 0) {
      iVar3 = local_34 + *(int *)ppi_00->parallel_cpi + -1;
      *(undefined8 *)((ppi_00->gf_group).ref_frame_list[0x36] + 4) =
           *(undefined8 *)
            (*(long *)((ppi_00->gf_group).arf_src_offset + 0x26) + (long)iVar3 * 0x1c0);
      *(undefined8 *)((ppi_00->gf_group).ref_frame_list[0x37] + 4) =
           *(undefined8 *)
            (*(long *)((ppi_00->gf_group).arf_src_offset + 0x26) + (long)iVar3 * 0x1c0 + 8);
      *(undefined8 *)(*(long *)((ppi_00->gf_group).arf_src_offset + 0x26) + (long)iVar3 * 0x1c0) =
           *(undefined8 *)(lVar2 + 0x41a60);
      *(undefined8 *)(*(long *)((ppi_00->gf_group).arf_src_offset + 0x26) + (long)iVar3 * 0x1c0 + 8)
           = *(undefined8 *)(lVar2 + 0x41a68);
    }
    local_34 = local_34 + *(int *)ppi_00->parallel_cpi;
    av1_alloc_cdef_buffers(_num_planes,_idx,in_stack_00000010,in_stack_0000000c,in_stack_00000008);
    *(undefined8 *)(lVar4 + 0x18) = in_RDX;
    *(long *)(lVar4 + 0x20) = lVar2;
    in_stack_ffffffffffffff80 = in_RSI;
    if (local_30 != 0) {
      in_stack_ffffffffffffff80 =
           (aom_internal_error_info *)(in_RDI + 0x20 + (long)(local_30 + -1) * 0x48);
    }
    *(aom_internal_error_info **)(lVar4 + 0x28) = in_stack_ffffffffffffff80;
    local_30 = local_30 + 1;
    *(undefined4 *)(lVar5 + 0xd0) = 0;
  }
  *(int *)(in_RDI + 0x12440) = in_ECX;
  return;
}

Assistant:

static inline void prepare_fpmt_workers(AV1_PRIMARY *ppi,
                                        AV1_COMP_DATA *first_cpi_data,
                                        AVxWorkerHook hook,
                                        int parallel_frame_count) {
  assert(parallel_frame_count <= ppi->num_fp_contexts &&
         parallel_frame_count > 1);

  PrimaryMultiThreadInfo *const p_mt_info = &ppi->p_mt_info;
  int num_workers = p_mt_info->num_workers;

  volatile int frame_idx = 0;
  volatile int i = 0;
  while (i < num_workers) {
    // Assign level 1 worker
    AVxWorker *frame_worker = p_mt_info->p_workers[frame_idx] =
        &p_mt_info->workers[i];
    AV1_COMP *cur_cpi = ppi->parallel_cpi[frame_idx];
    MultiThreadInfo *mt_info = &cur_cpi->mt_info;
    // This 'aom_internal_error_info' pointer is not derived from the local
    // pointer ('AV1_COMMON *const cm') to silence the compiler warning
    // "variable 'cm' might be clobbered by 'longjmp' or 'vfork' [-Wclobbered]".
    struct aom_internal_error_info *const error = cur_cpi->common.error;

    // The jmp_buf is valid only within the scope of the function that calls
    // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
    // before it returns.
    if (setjmp(error->jmp)) {
      error->setjmp = 0;
      restore_workers_after_fpmt(ppi, parallel_frame_count, i);
      aom_internal_error_copy(&ppi->error, error);
    }
    error->setjmp = 1;

    AV1_COMMON *const cm = &cur_cpi->common;
    // Assign start of level 2 worker pool
    mt_info->workers = &p_mt_info->workers[i];
    mt_info->tile_thr_data = &p_mt_info->tile_thr_data[i];
    // Assign number of workers for each frame in the parallel encode set.
    mt_info->num_workers = compute_num_workers_per_frame(
        num_workers - i, parallel_frame_count - frame_idx);
    for (int j = MOD_FP; j < NUM_MT_MODULES; j++) {
      mt_info->num_mod_workers[j] =
          AOMMIN(mt_info->num_workers, p_mt_info->num_mod_workers[j]);
    }
    if (p_mt_info->cdef_worker != NULL) {
      mt_info->cdef_worker = &p_mt_info->cdef_worker[i];

      // Back up the original cdef_worker pointers.
      mt_info->restore_state_buf.cdef_srcbuf = mt_info->cdef_worker->srcbuf;
      const int num_planes = av1_num_planes(cm);
      for (int plane = 0; plane < num_planes; plane++)
        mt_info->restore_state_buf.cdef_colbuf[plane] =
            mt_info->cdef_worker->colbuf[plane];
    }
#if !CONFIG_REALTIME_ONLY
    if (is_restoration_used(cm)) {
      // Back up the original LR buffers before update.
      int idx = i + mt_info->num_workers - 1;
      assert(idx < mt_info->lr_row_sync.num_workers);
      mt_info->restore_state_buf.rst_tmpbuf =
          mt_info->lr_row_sync.lrworkerdata[idx].rst_tmpbuf;
      mt_info->restore_state_buf.rlbs =
          mt_info->lr_row_sync.lrworkerdata[idx].rlbs;

      // Update LR buffers.
      mt_info->lr_row_sync.lrworkerdata[idx].rst_tmpbuf = cm->rst_tmpbuf;
      mt_info->lr_row_sync.lrworkerdata[idx].rlbs = cm->rlbs;
    }
#endif

    i += mt_info->num_workers;

    // At this stage, the thread specific CDEF buffers for the current frame's
    // 'common' and 'cdef_sync' only need to be allocated. 'cdef_worker' has
    // already been allocated across parallel frames.
    av1_alloc_cdef_buffers(cm, &p_mt_info->cdef_worker, &mt_info->cdef_sync,
                           p_mt_info->num_workers, 0);

    frame_worker->hook = hook;
    frame_worker->data1 = cur_cpi;
    frame_worker->data2 = (frame_idx == 0)
                              ? first_cpi_data
                              : &ppi->parallel_frames_data[frame_idx - 1];
    frame_idx++;
    error->setjmp = 0;
  }
  p_mt_info->p_num_workers = parallel_frame_count;
}